

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

InterpolationViewer * FindPastViewer(AActor *actor)

{
  uint uVar1;
  uint uVar2;
  InterpolationViewer *pIVar3;
  undefined1 local_a0 [8];
  InterpolationViewer iview;
  uint i;
  AActor *actor_local;
  
  iview.New.Angles.CamRoll.Degrees._4_4_ = 0;
  while( true ) {
    uVar2 = iview.New.Angles.CamRoll.Degrees._4_4_;
    uVar1 = TArray<InterpolationViewer,_InterpolationViewer>::Size(&PastViewers);
    if (uVar1 <= uVar2) {
      InterpolationViewer::InterpolationViewer((InterpolationViewer *)local_a0);
      memset(local_a0,0,0x80);
      iview.ViewActor._0_4_ = 0xffffffff;
      local_a0 = (undefined1  [8])actor;
      TArray<DVector3a,_DVector3a>::Clear(&InterpolationPath);
      uVar2 = TArray<InterpolationViewer,_InterpolationViewer>::Push
                        (&PastViewers,(InterpolationViewer *)local_a0);
      pIVar3 = TArray<InterpolationViewer,_InterpolationViewer>::operator[]
                         (&PastViewers,(ulong)uVar2);
      return pIVar3;
    }
    pIVar3 = TArray<InterpolationViewer,_InterpolationViewer>::operator[]
                       (&PastViewers,(ulong)iview.New.Angles.CamRoll.Degrees._4_4_);
    if (pIVar3->ViewActor == actor) break;
    iview.New.Angles.CamRoll.Degrees._4_4_ = iview.New.Angles.CamRoll.Degrees._4_4_ + 1;
  }
  pIVar3 = TArray<InterpolationViewer,_InterpolationViewer>::operator[]
                     (&PastViewers,(ulong)iview.New.Angles.CamRoll.Degrees._4_4_);
  return pIVar3;
}

Assistant:

static InterpolationViewer *FindPastViewer (AActor *actor)
{
	for (unsigned int i = 0; i < PastViewers.Size(); ++i)
	{
		if (PastViewers[i].ViewActor == actor)
		{
			return &PastViewers[i];
		}
	}

	// Not found, so make a new one
	InterpolationViewer iview;
	memset(&iview, 0, sizeof(iview));
	iview.ViewActor = actor;
	iview.otic = -1;
	InterpolationPath.Clear();
	return &PastViewers[PastViewers.Push (iview)];
}